

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O1

string * __thiscall
util::make_string<char_const(&)[35],char&,char_const(&)[2]>
          (string *__return_storage_ptr__,util *this,char (*args) [35],char *args_1,
          char (*args_2) [2])

{
  size_t sVar1;
  ostringstream ss;
  char local_1a1;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  sVar1 = strlen((char *)this);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,(char *)this,sVar1);
  local_1a1 = (*args)[0];
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,&local_1a1,1);
  sVar1 = strlen(args_1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,args_1,sVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string make_string(Args&& ... args)
{
    std::ostringstream ss;
    (void)std::initializer_list<bool> {(ss << args, false)...};
    return ss.str();
}